

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

void __thiscall cmCTest::SetConfigType(cmCTest *this,string *ct)

{
  pointer pPVar1;
  undefined1 local_38 [8];
  string confTypeEnv;
  string *ct_local;
  cmCTest *this_local;
  
  confTypeEnv.field_2._8_8_ = ct;
  pPVar1 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  std::__cxx11::string::operator=((string *)&pPVar1->ConfigType,(string *)ct);
  pPVar1 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  cmsys::SystemTools::ReplaceString(&pPVar1->ConfigType,".\\","");
  pPVar1 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 "CMAKE_CONFIG_TYPE=",&pPVar1->ConfigType);
  cmsys::SystemTools::PutEnv
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmCTest::SetConfigType(const std::string& ct)
{
  this->Impl->ConfigType = ct;
  cmSystemTools::ReplaceString(this->Impl->ConfigType, ".\\", "");
  std::string confTypeEnv = "CMAKE_CONFIG_TYPE=" + this->Impl->ConfigType;
  cmSystemTools::PutEnv(confTypeEnv);
}